

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

Iterator * __thiscall leveldb::ModelDB::NewIterator(ModelDB *this,ReadOptions *options)

{
  _Rb_tree_header *p_Var1;
  Snapshot *pSVar2;
  Iterator *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  
  pSVar2 = options->snapshot;
  if (pSVar2 == (Snapshot *)0x0) {
    this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)operator_new(0x30);
    p_Var1 = &(this_01->_M_impl).super__Rb_tree_header;
    (this_01->_M_impl).super__Rb_tree_header._M_header._M_color = _S_red;
    (this_01->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this_01->_M_impl).super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (this_01->_M_impl).super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (this_01->_M_impl).super__Rb_tree_header._M_node_count = 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(this_01,&(this->map_)._M_t);
    this_00 = (Iterator *)operator_new(0x40);
    Iterator::Iterator(this_00);
    this_00->_vptr_Iterator = (_func_int **)&PTR__ModelIter_0015bd68;
    this_00[1]._vptr_Iterator = (_func_int **)this_01;
    *(undefined1 *)&this_00[1].cleanup_head_.function = 1;
    this_00[1].cleanup_head_.arg1 = p_Var1;
  }
  else {
    this_00 = (Iterator *)operator_new(0x40);
    Iterator::Iterator(this_00);
    this_00->_vptr_Iterator = (_func_int **)&PTR__ModelIter_0015bd68;
    this_00[1]._vptr_Iterator = (_func_int **)(pSVar2 + 1);
    *(undefined1 *)&this_00[1].cleanup_head_.function = 0;
    this_00[1].cleanup_head_.arg1 = pSVar2 + 2;
  }
  return this_00;
}

Assistant:

Iterator* NewIterator(const ReadOptions& options) override {
    if (options.snapshot == nullptr) {
      KVMap* saved = new KVMap;
      *saved = map_;
      return new ModelIter(saved, true);
    } else {
      const KVMap* snapshot_state =
          &(reinterpret_cast<const ModelSnapshot*>(options.snapshot)->map_);
      return new ModelIter(snapshot_state, false);
    }
  }